

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwnsc.cpp
# Opt level: O2

string * GetNwnInstallPath_abi_cxx11_(string *__return_storage_ptr__,int CompilerVersion,bool Quiet)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Rb_tree_header *p_Var2;
  bool bVar3;
  char *pcVar4;
  Writer *pWVar5;
  JSONValue *this;
  _Rb_tree<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
  *__x;
  iterator iVar6;
  mapped_type *ppJVar7;
  JSONArray *__x_00;
  pointer __rhs;
  string RootDir;
  string GameStr;
  JSONArray array;
  string settingsFile;
  string KeyFile;
  undefined1 local_4a8 [24];
  char *local_490;
  LineNumber local_488;
  char *local_480;
  VerboseLevel local_478;
  Logger *local_470;
  bool local_468;
  Logger *local_460;
  char *local_458;
  DispatchAction local_450;
  pointer local_448;
  pointer pbStack_440;
  pointer local_438;
  JSONObject root;
  string str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e0;
  stringstream buffer;
  undefined1 local_3b0 [376];
  ifstream InStream;
  undefined1 local_228 [16];
  LineNumber local_218;
  char *local_210;
  VerboseLevel local_208;
  Logger *local_200;
  bool local_1f8;
  Logger *local_1f0;
  char *local_1e8;
  DispatchAction local_1e0;
  pointer local_1d8;
  pointer pbStack_1d0;
  pointer local_1c8;
  
  paVar1 = &RootDir.field_2;
  RootDir._M_string_length = 0;
  RootDir.field_2._M_local_buf[0] = '\0';
  KeyFile._M_dataplus._M_p = (pointer)&KeyFile.field_2;
  KeyFile._M_string_length = 0;
  KeyFile.field_2._M_local_buf[0] = '\0';
  RootDir._M_dataplus._M_p = (pointer)paVar1;
  pcVar4 = getenv("NWN_ROOT");
  if (pcVar4 == (char *)0x0) {
    if (CompilerVersion < 0xae) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&InStream);
    }
    else {
      settingsFile._M_dataplus._M_p = (pointer)&settingsFile.field_2;
      settingsFile._M_string_length = 0;
      settingsFile.field_2._M_local_buf[0] = '\0';
      GetHomeDirectory_abi_cxx11_();
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&InStream,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&buffer,
                     "/.config/Beamdog Client/settings.json");
      std::__cxx11::string::operator=((string *)&settingsFile,(string *)&InStream);
      std::__cxx11::string::~string((string *)&InStream);
      std::__cxx11::string::~string((string *)&buffer);
      _InStream = &PTR__Writer_0019fa78;
      local_228._0_4_ = 4;
      local_228._8_8_ =
           "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/nwnsc/nwnsc.cpp";
      local_218 = 0x113;
      local_210 = "std::string GetNwnInstallPath(int, bool)";
      local_208 = 0;
      local_200 = (Logger *)0x0;
      local_1f8 = false;
      local_1f0 = (Logger *)0x0;
      local_1e8 = "";
      local_1e0 = NormalLog;
      local_1d8 = (pointer)0x0;
      pbStack_1d0 = (pointer)0x0;
      local_1c8 = (pointer)0x0;
      pWVar5 = el::base::Writer::construct((Writer *)&InStream,1,"default");
      pWVar5 = el::base::Writer::operator<<(pWVar5,(char (*) [15])" settingsFile ");
      el::base::Writer::operator<<(pWVar5,&settingsFile);
      el::base::Writer::~Writer((Writer *)&InStream);
      bVar3 = FileExists(&settingsFile);
      if (bVar3) {
        std::ifstream::ifstream(&InStream,(string *)&settingsFile,_S_in);
        std::__cxx11::stringstream::stringstream((stringstream *)&buffer);
        std::ostream::operator<<(local_3b0,(streambuf *)local_228);
        std::__cxx11::stringbuf::str();
        this = JSON::Parse(str._M_dataplus._M_p);
        if (this != (JSONValue *)0x0) {
          p_Var2 = &root._M_t._M_impl.super__Rb_tree_header;
          root._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          root._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          root._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          root._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
          root._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
          bVar3 = JSONValue::IsObject(this);
          if (bVar3) {
            __x = &JSONValue::AsObject_abi_cxx11_(this)->_M_t;
            std::
            _Rb_tree<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
            ::operator=(&root._M_t,__x);
            std::__cxx11::wstring::wstring((wstring *)local_4a8,L"folders",(allocator *)&local_3e0);
            iVar6 = std::
                    _Rb_tree<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
                    ::find(&root._M_t,(key_type *)local_4a8);
            if ((_Rb_tree_header *)iVar6._M_node == p_Var2) {
              std::__cxx11::wstring::~wstring((wstring *)local_4a8);
            }
            else {
              std::__cxx11::wstring::wstring((wstring *)&GameStr,L"folders",(allocator *)&array);
              ppJVar7 = std::
                        map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
                        ::operator[](&root,(key_type *)&GameStr);
              bVar3 = JSONValue::IsArray(*ppJVar7);
              std::__cxx11::wstring::~wstring((wstring *)&GameStr);
              std::__cxx11::wstring::~wstring((wstring *)local_4a8);
              if (bVar3) {
                std::__cxx11::wstring::wstring
                          ((wstring *)local_4a8,L"folders",(allocator *)&GameStr);
                ppJVar7 = std::
                          map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
                          ::operator[](&root,(key_type *)local_4a8);
                __x_00 = JSONValue::AsArray(*ppJVar7);
                std::vector<JSONValue_*,_std::allocator<JSONValue_*>_>::vector(&array,__x_00);
                std::__cxx11::wstring::~wstring((wstring *)local_4a8);
                if (array.super__Vector_base<JSONValue_*,_std::allocator<JSONValue_*>_>._M_impl.
                    super__Vector_impl_data._M_finish !=
                    array.super__Vector_base<JSONValue_*,_std::allocator<JSONValue_*>_>._M_impl.
                    super__Vector_impl_data._M_start) {
                  JSONValue::AsString_abi_cxx11_
                            ((wstring *)&GameStr,
                             *array.super__Vector_base<JSONValue_*,_std::allocator<JSONValue_*>_>.
                              _M_impl.super__Vector_impl_data._M_start);
                  ws2s((string *)local_4a8,(wstring *)&GameStr);
                  std::__cxx11::string::operator=((string *)&RootDir,(string *)local_4a8);
                  std::__cxx11::string::~string((string *)local_4a8);
                  std::__cxx11::wstring::~wstring((wstring *)&GameStr);
                }
                std::__cxx11::string::push_back((char)&RootDir);
                GameStr._M_dataplus._M_p = (pointer)&GameStr.field_2;
                GameStr._M_string_length = 0;
                GameStr.field_2._M_local_buf[0] = '\0';
                for (__rhs = NwnVersions_abi_cxx11_.
                             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                    __rhs != NwnVersions_abi_cxx11_.
                             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish; __rhs = __rhs + 1) {
                  std::operator+(&local_3e0,&RootDir,&__rhs->first);
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_4a8,&local_3e0,&KeyFile);
                  bVar3 = FileExists((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_4a8);
                  std::__cxx11::string::~string((string *)local_4a8);
                  std::__cxx11::string::~string((string *)&local_3e0);
                  if (bVar3) {
                    std::__cxx11::string::append((string *)&RootDir);
                    std::__cxx11::string::push_back((char)&RootDir);
                    std::__cxx11::string::_M_assign((string *)&GameStr);
                    break;
                  }
                }
                local_4a8._0_8_ = &PTR__Writer_0019fa78;
                local_4a8._8_8_ = (LogMessage *)0x0;
                local_4a8._16_4_ = L'\x04';
                local_490 = 
                "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/nwnsc/nwnsc.cpp"
                ;
                local_488 = 0x143;
                local_480 = "std::string GetNwnInstallPath(int, bool)";
                local_478 = 0;
                local_470 = (Logger *)0x0;
                local_468 = false;
                local_460 = (Logger *)0x0;
                local_458 = "";
                local_450 = NormalLog;
                local_448 = (pointer)0x0;
                pbStack_440 = (pointer)0x0;
                local_438 = (pointer)0x0;
                pWVar5 = el::base::Writer::construct((Writer *)local_4a8,1,"default");
                pWVar5 = el::base::Writer::operator<<(pWVar5,(char (*) [10])" RootDir ");
                el::base::Writer::operator<<(pWVar5,&RootDir);
                el::base::Writer::~Writer((Writer *)local_4a8);
                if (!Quiet) {
                  PrintfTextOut::WriteText
                            (&g_TextOut,"Base game %s location - %s\n",GameStr._M_dataplus._M_p,
                             RootDir._M_dataplus._M_p);
                }
                std::__cxx11::string::~string((string *)&GameStr);
                std::_Vector_base<JSONValue_*,_std::allocator<JSONValue_*>_>::~_Vector_base
                          (&array.super__Vector_base<JSONValue_*,_std::allocator<JSONValue_*>_>);
              }
            }
          }
          std::
          _Rb_tree<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
          ::~_Rb_tree(&root._M_t);
        }
        std::__cxx11::string::~string((string *)&str);
        std::__cxx11::stringstream::~stringstream((stringstream *)&buffer);
        std::ifstream::~ifstream(&InStream);
      }
      else {
        _InStream = (undefined **)local_228;
        local_228._0_4_ = local_228._0_4_ & 0xffffff00;
        GetHomeDirectory_abi_cxx11_();
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&buffer,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_4a8,"/.local/share/Steam/steamapps/common/Neverwinter Nights/");
        std::__cxx11::string::operator=((string *)&InStream,(string *)&buffer);
        std::__cxx11::string::~string((string *)&buffer);
        std::__cxx11::string::~string((string *)local_4a8);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&buffer,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &InStream,&KeyFile);
        bVar3 = FileExists((string *)&buffer);
        std::__cxx11::string::~string((string *)&buffer);
        if (bVar3) {
          std::__cxx11::string::_M_assign((string *)&RootDir);
        }
        std::__cxx11::string::~string((string *)&InStream);
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)RootDir._M_dataplus._M_p == paVar1) {
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             CONCAT71(RootDir.field_2._M_allocated_capacity._1_7_,RootDir.field_2._M_local_buf[0]);
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = RootDir.field_2._8_8_;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = RootDir._M_dataplus._M_p;
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             CONCAT71(RootDir.field_2._M_allocated_capacity._1_7_,RootDir.field_2._M_local_buf[0]);
      }
      __return_storage_ptr__->_M_string_length = RootDir._M_string_length;
      RootDir._M_string_length = 0;
      RootDir.field_2._M_local_buf[0] = '\0';
      RootDir._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::~string((string *)&settingsFile);
    }
  }
  else {
    std::__cxx11::string::assign((char *)&RootDir);
    if (RootDir._M_dataplus._M_p[RootDir._M_string_length - 1] != '/') {
      std::__cxx11::string::push_back((char)&RootDir);
    }
    std::__cxx11::string::assign((char *)&KeyFile);
    if (!Quiet) {
      PrintfTextOut::WriteText
                (&g_TextOut,"Base game location from NWN_ROOT - %s\n",RootDir._M_dataplus._M_p);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)RootDir._M_dataplus._M_p == paVar1) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(RootDir.field_2._M_allocated_capacity._1_7_,RootDir.field_2._M_local_buf[0]);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = RootDir.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = RootDir._M_dataplus._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(RootDir.field_2._M_allocated_capacity._1_7_,RootDir.field_2._M_local_buf[0]);
    }
    __return_storage_ptr__->_M_string_length = RootDir._M_string_length;
    RootDir._M_string_length = 0;
    RootDir.field_2._M_local_buf[0] = '\0';
    RootDir._M_dataplus._M_p = (pointer)paVar1;
  }
  std::__cxx11::string::~string((string *)&KeyFile);
  std::__cxx11::string::~string((string *)&RootDir);
  return __return_storage_ptr__;
}

Assistant:

std::string
GetNwnInstallPath(int CompilerVersion, bool Quiet)
/*++

Routine Description:

	This routine attempts to auto detect the NWN1 installation path from the
	registry.

Arguments:

	None.

Return Value:

	The routine returns the game installation path if successful.  Otherwise,
	an std::exception is raised.

Environment:

	User mode.

--*/
{
    std::string RootDir;
    char *EnvNwnRoot;
    std::string KeyFile;

    EnvNwnRoot = getenv("NWN_ROOT");

    if (EnvNwnRoot != NULL) {
        RootDir = EnvNwnRoot;
#if defined(_WINDOWS)
        if (RootDir.back() != '\\')
            RootDir.push_back( '\\' );
        KeyFile = "\\data\\nwn_base.key";
#else
        if (RootDir.back() != '/')
            RootDir.push_back('/');
        KeyFile = "/data/nwn_base.key";
#endif
        if (!Quiet) {
            g_TextOut.WriteText("Base game location from NWN_ROOT - %s\n", RootDir.c_str());
        }
        return RootDir;
    } else {
        if (CompilerVersion >= 174) {

            std::string settingsFile;

#if defined(__APPLE__)
            settingsFile = GetHomeDirectory() + "/Library/Application Support/Beamdog Client/settings.json";
#elif defined(__linux__)
            settingsFile = GetHomeDirectory() + "/.config/Beamdog Client/settings.json";
#elif defined(_WINDOWS)
			settingsFile = GetHomeDirectory() + "\\Beamdog Client\\settings.json";
#endif
            LOG(DEBUG) << " settingsFile " << settingsFile;

            if (FileExists(settingsFile)) {
                std::ifstream InStream(settingsFile, std::ifstream::in);
                std::stringstream buffer;
                buffer << InStream.rdbuf();

                std::string str(buffer.str());

                // Parse data
                JSONValue *value = JSON::Parse(str.c_str());

                if (value != NULL) {

                    JSONObject root;
                    if (value->IsObject() != false) {
                        root = value->AsObject();

                        // Retrieving an array
                        if (root.find(L"folders") != root.end() && root[L"folders"]->IsArray()) {
                            JSONArray array = root[L"folders"]->AsArray();

                            if (array.size() > 0) {
                                RootDir = ws2s(array[0]->AsString());
                            }

#ifdef _WINDOWS
                            RootDir.push_back('\\');
#else
                            RootDir.push_back('/');
#endif

                            std::string GameStr;

                            std::vector<std::pair<std::string, std::string>>::iterator it;  // declare an iterator to a vector of strings
                            for (it = NwnVersions.begin(); it != NwnVersions.end(); it++) {
                                if (FileExists(RootDir + it->first + KeyFile)) {
                                    RootDir += it->first;
#ifdef _WINDOWS
                                    RootDir.push_back('\\');
#else
                                    RootDir.push_back('/');
#endif
                                    GameStr = it->second;
                                    break;
                                }
                            }

                            LOG(DEBUG) << " RootDir " << RootDir;
                            if (!Quiet) {
                                g_TextOut.WriteText("Base game %s location - %s\n", GameStr.c_str(), RootDir.c_str());
                            }
                        }

                    }
                }
            } else {
                std::string SteamRootDir;
#if defined(__APPLE__)
                SteamRootDir = GetHomeDirectory() + "/Library/Application Support/Steam/steamapps/common/Neverwinter Nights/";
#elif defined(__linux__)
                SteamRootDir = GetHomeDirectory() + "/.local/share/Steam/steamapps/common/Neverwinter Nights/";
#elif defined(_WINDOWS)
                SteamRootDir = "C:\\Program Files (x86)\\Steam\\steamapps\\common\\Neverwinter Nights\\";
#endif
                if (FileExists(SteamRootDir + KeyFile))
                    RootDir = SteamRootDir;
            }
            return RootDir;

        } else {
#if defined(_WINDOWS)
            HKEY Key;
            LONG Status;

            Status = RegOpenKeyEx(
                HKEY_LOCAL_MACHINE,
                "SOFTWARE\\BioWare\\NWN\\Neverwinter",
                REG_OPTION_RESERVED,
#ifdef _WIN64
                KEY_QUERY_VALUE | KEY_WOW64_32KEY,
#else
                KEY_QUERY_VALUE,
#endif
                &Key);

            if (Status != NO_ERROR)
                throw std::runtime_error( "Unable to open NWN registry key" );

            try
            {
                    CHAR                NameBuffer[ MAX_PATH + 1 ];
                    DWORD               NameBufferSize;
                    bool                FoundIt;
                    static const char * ValueNames[ ] =
                    {
                        "Path",     // Retail NWN
                        "Location", // Steam NWN
                    };

                    FoundIt = false;

                    for (size_t i = 0; i < _countof( ValueNames ); i += 1)
                    {
                        NameBufferSize = sizeof( NameBuffer ) - sizeof( NameBuffer[ 0 ] );

                        Status = RegQueryValueExA(
                            Key,
                            ValueNames[ i ],
                            nullptr,
                            nullptr,
                            (LPBYTE) NameBuffer,
                            &NameBufferSize);

                        if (Status != NO_ERROR)
                            continue;

                        //
                        // Strip trailing nullptr byte if it exists.
                        //

                        if ((NameBufferSize > 0) &&
                            (NameBuffer[ NameBufferSize - 1 ] == '\0'))
                            NameBufferSize -= 1;

                        std::string NwnRootDir = std::string( NameBuffer, NameBufferSize );

                        if (!Quiet) {
                            g_TextOut.WriteText("Base game location - %s\n", NwnRootDir.c_str());
                        }

                        return NwnRootDir;
                    }

                    throw std::exception( "Unable to read Path from NWN registry key" );
            }
            catch (...)
            {
                RegCloseKey( Key );
                throw;
            }
#else
            return "";
#endif
        }
    }
}